

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCamera.cpp
# Opt level: O2

void __thiscall chrono::ChCamera::ArchiveOUT(ChCamera *this,ChArchiveOut *archive)

{
  ChNameValue<bool> local_c0;
  ChNameValue<double> local_a8;
  ChNameValue<double> local_90;
  ChNameValue<double> local_78;
  ChNameValue<chrono::ChVector<double>_> local_60;
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<chrono::ChVector<double>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChCamera>(archive);
  local_30._value = &this->position;
  local_30._name = "position";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(archive,&local_30);
  local_48._value = &this->aimpoint;
  local_48._name = "aimpoint";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(archive,&local_48);
  local_60._value = &this->upvector;
  local_60._name = "upvector";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(archive,&local_60);
  local_78._value = &this->angle;
  local_78._name = "angle";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(archive,&local_78);
  local_90._value = &this->fov;
  local_90._name = "fov";
  local_90._flags = '\0';
  ChArchiveOut::operator<<(archive,&local_90);
  local_a8._value = &this->hvratio;
  local_a8._name = "hvratio";
  local_a8._flags = '\0';
  ChArchiveOut::operator<<(archive,&local_a8);
  local_c0._value = &this->isometric;
  local_c0._name = "isometric";
  local_c0._flags = '\0';
  ChArchiveOut::operator<<(archive,&local_c0);
  return;
}

Assistant:

void ChCamera::ArchiveOUT(ChArchiveOut& archive) {
    // version number
    archive.VersionWrite<ChCamera>();
    // serialize all member data:
    archive << CHNVP(position);
    archive << CHNVP(aimpoint);
    archive << CHNVP(upvector);
    archive << CHNVP(angle);
    archive << CHNVP(fov);
    archive << CHNVP(hvratio);
    archive << CHNVP(isometric);
}